

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O0

spvc_result
spvc_compiler_msl_remap_constexpr_sampler_by_binding
          (spvc_compiler compiler,uint desc_set,uint binding,spvc_msl_constexpr_sampler *sampler)

{
  spvc_context_s *this;
  undefined1 local_cc [8];
  MSLConstexprSampler samp;
  CompilerMSL *msl;
  allocator local_49;
  string local_48;
  spvc_msl_constexpr_sampler *local_28;
  spvc_msl_constexpr_sampler *sampler_local;
  uint binding_local;
  uint desc_set_local;
  spvc_compiler compiler_local;
  
  local_28 = sampler;
  sampler_local._0_4_ = binding;
  sampler_local._4_4_ = desc_set;
  _binding_local = compiler;
  if (compiler->backend == SPVC_BACKEND_MSL) {
    samp._92_8_ = std::
                  unique_ptr<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>::
                  get(&compiler->compiler);
    spirv_cross::MSLConstexprSampler::MSLConstexprSampler((MSLConstexprSampler *)local_cc);
    spvc_convert_msl_sampler((MSLConstexprSampler *)local_cc,local_28);
    spirv_cross::CompilerMSL::remap_constexpr_sampler_by_binding
              ((CompilerMSL *)samp._92_8_,sampler_local._4_4_,(uint)sampler_local,
               (MSLConstexprSampler *)local_cc);
    compiler_local._4_4_ = SPVC_SUCCESS;
  }
  else {
    this = compiler->context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"MSL function used on a non-MSL backend.",&local_49);
    spvc_context_s::report_error(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    compiler_local._4_4_ = SPVC_ERROR_INVALID_ARGUMENT;
  }
  return compiler_local._4_4_;
}

Assistant:

spvc_result spvc_compiler_msl_remap_constexpr_sampler_by_binding(spvc_compiler compiler,
                                                                 unsigned desc_set, unsigned binding,
                                                                 const spvc_msl_constexpr_sampler *sampler)
{
#if SPIRV_CROSS_C_API_MSL
	if (compiler->backend != SPVC_BACKEND_MSL)
	{
		compiler->context->report_error("MSL function used on a non-MSL backend.");
		return SPVC_ERROR_INVALID_ARGUMENT;
	}

	auto &msl = *static_cast<CompilerMSL *>(compiler->compiler.get());
	MSLConstexprSampler samp;
	spvc_convert_msl_sampler(samp, sampler);
	msl.remap_constexpr_sampler_by_binding(desc_set, binding, samp);
	return SPVC_SUCCESS;
#else
	(void)desc_set;
	(void)binding;
	(void)sampler;
	compiler->context->report_error("MSL function used on a non-MSL backend.");
	return SPVC_ERROR_INVALID_ARGUMENT;
#endif
}